

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall chaiscript::exception::eval_error::~eval_error(eval_error *this)

{
  eval_error *this_local;
  
  ~eval_error(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

~eval_error() noexcept override = default;